

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void FRemapTable::StaticSerializeTranslations(FSerializer *arc)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong in_RAX;
  ulong uVar4;
  long lVar5;
  FRemapTable *pFVar6;
  int w;
  undefined8 local_38;
  
  local_38 = in_RAX;
  bVar2 = FSerializer::BeginArray(arc,"translations");
  if (bVar2) {
    if (arc->w == (FWriter *)0x0) {
      bVar2 = FSerializer::BeginObject(arc,(char *)0x0);
      if (bVar2) {
        do {
          ::Serialize(arc,"index",(int32_t *)((long)&local_38 + 4),(int32_t *)0x0);
          pFVar6 = (FRemapTable *)0x0;
          if (local_38._4_4_ <
              translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count) {
            pFVar6 = translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array
                     [local_38._4_4_].Ptr;
          }
          if (pFVar6 == (FRemapTable *)0x0) {
            pFVar6 = (FRemapTable *)operator_new(0x20);
            pFVar6->Inactive = false;
            Alloc(pFVar6,0x100);
            lVar5 = (long)(int)local_38._4_4_;
            if (-1 < lVar5) {
              if (translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count <=
                  local_38._4_4_) {
                TArray<FRemapTablePtr,_FRemapTable_*>::Resize
                          (&translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>,
                           local_38._4_4_ + 1);
              }
              translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar5].Ptr =
                   pFVar6;
            }
          }
          Serialize(pFVar6,arc);
          FSerializer::EndObject(arc);
          bVar2 = FSerializer::BeginObject(arc,(char *)0x0);
        } while (bVar2);
      }
    }
    else {
      local_38 = local_38 & 0xffffffff00000000;
      if (translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count != 0) {
        uVar3 = 0;
        do {
          pFVar6 = translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[uVar3].Ptr
          ;
          if (pFVar6 != (FRemapTable *)0x0) {
            if (*pFVar6->Remap == '\0') {
              uVar1 = 0;
              do {
                uVar4 = uVar1;
                if (uVar4 == 0xff) break;
                uVar1 = uVar4 + 1;
              } while (uVar4 + 1 == (ulong)pFVar6->Remap[uVar4 + 1]);
              if (0xfe < uVar4) goto LAB_0032ff75;
            }
            bVar2 = FSerializer::BeginObject(arc,(char *)0x0);
            if (bVar2) {
              ::Serialize(arc,"index",(uint32_t *)&local_38,(uint32_t *)0x0);
              Serialize(pFVar6,arc);
              FSerializer::EndObject(arc);
            }
          }
LAB_0032ff75:
          uVar3 = (uint32_t)local_38 + 1;
          local_38 = CONCAT44(local_38._4_4_,uVar3);
        } while (uVar3 < translationtables[4].super_TArray<FRemapTablePtr,_FRemapTable_*>.Count);
      }
    }
    FSerializer::EndArray(arc);
  }
  return;
}

Assistant:

void FRemapTable::StaticSerializeTranslations(FSerializer &arc)
{
	if (arc.BeginArray("translations"))
	{
		// Does this level have custom translations?
		FRemapTable *trans;
		int w;
		if (arc.isWriting())
		{
			for (unsigned int i = 0; i < translationtables[TRANSLATION_LevelScripted].Size(); ++i)
			{
				trans = translationtables[TRANSLATION_LevelScripted][i];
				if (trans != NULL && !trans->IsIdentity())
				{
					if (arc.BeginObject(nullptr))
					{
						arc("index", i);
						trans->Serialize(arc);
						arc.EndObject();
					}
				}
			}
		}
		else
		{
			while (arc.BeginObject(nullptr))
			{
				arc("index", w);
				trans = translationtables[TRANSLATION_LevelScripted].GetVal(w);
				if (trans == NULL)
				{
					trans = new FRemapTable;
					translationtables[TRANSLATION_LevelScripted].SetVal(w, trans);
				}
				trans->Serialize(arc);
				arc.EndObject();
			}
		}
		arc.EndArray();
	}
}